

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

int P_Thing_CheckInputNum(player_t *p,int inputnum)

{
  int iVar1;
  
  iVar1 = 0;
  if (p != (player_t *)0x0) {
    iVar1 = 0;
    switch(inputnum) {
    case 0:
      return p->original_oldbuttons;
    case 1:
      return (p->original_cmd).buttons;
    case 2:
      return (int)(p->original_cmd).pitch;
    case 3:
      return (int)(p->original_cmd).yaw;
    case 4:
      return (int)(p->original_cmd).roll;
    case 5:
      return (int)(p->original_cmd).forwardmove;
    case 6:
      return (int)(p->original_cmd).sidemove;
    case 7:
      return (int)(p->original_cmd).upmove;
    case 8:
      return p->oldbuttons;
    case 9:
      return (p->cmd).ucmd.buttons;
    case 10:
      return (int)(p->cmd).ucmd.pitch;
    case 0xb:
      return (int)(p->cmd).ucmd.yaw;
    case 0xc:
      return (int)(p->cmd).ucmd.roll;
    case 0xd:
      return (int)(p->cmd).ucmd.forwardmove;
    case 0xe:
      return (int)(p->cmd).ucmd.sidemove;
    case 0xf:
      iVar1 = (int)(p->cmd).ucmd.upmove;
    }
  }
  return iVar1;
}

Assistant:

int P_Thing_CheckInputNum(player_t *p, int inputnum)
{
	int renum = 0;
	if (p)
	{
		switch (inputnum)
		{
		case INPUT_OLDBUTTONS:		renum = p->original_oldbuttons;			break;
		case INPUT_BUTTONS:			renum = p->original_cmd.buttons;		break;
		case INPUT_PITCH:			renum = p->original_cmd.pitch;			break;
		case INPUT_YAW:				renum = p->original_cmd.yaw;			break;
		case INPUT_ROLL:			renum = p->original_cmd.roll;			break;
		case INPUT_FORWARDMOVE:		renum = p->original_cmd.forwardmove;	break;
		case INPUT_SIDEMOVE:		renum = p->original_cmd.sidemove;		break;
		case INPUT_UPMOVE:			renum = p->original_cmd.upmove;			break;

		case MODINPUT_OLDBUTTONS:	renum = p->oldbuttons;					break;
		case MODINPUT_BUTTONS:		renum = p->cmd.ucmd.buttons;			break;
		case MODINPUT_PITCH:		renum = p->cmd.ucmd.pitch;				break;
		case MODINPUT_YAW:			renum = p->cmd.ucmd.yaw;				break;
		case MODINPUT_ROLL:			renum = p->cmd.ucmd.roll;				break;
		case MODINPUT_FORWARDMOVE:	renum = p->cmd.ucmd.forwardmove;		break;
		case MODINPUT_SIDEMOVE:		renum = p->cmd.ucmd.sidemove;			break;
		case MODINPUT_UPMOVE:		renum = p->cmd.ucmd.upmove;				break;

		default:					renum = 0;								break;
		}
	}
	return renum;
}